

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O2

int require_newline(IncludeState *state)

{
  Token TVar1;
  uint uVar2;
  
  TVar1 = lexer(state);
  pushback(state);
  uVar2 = 1;
  if ((TVar1 != 10) && (TVar1 != TOKEN_INCOMPLETE_COMMENT)) {
    uVar2 = (uint)(TVar1 == TOKEN_EOI);
  }
  return uVar2;
}

Assistant:

static int require_newline(IncludeState *state)
{
    const Token token = lexer(state);
    pushback(state);  // rewind no matter what.
    return ( (token == TOKEN_INCOMPLETE_COMMENT) || // call it an eol.
             (token == ((Token) '\n')) || (token == TOKEN_EOI) );
}